

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOStreamBuffer.cpp
# Opt level: O2

void __thiscall
IOStreamBufferTest_creationTest_Test::~IOStreamBufferTest_creationTest_Test
          (IOStreamBufferTest_creationTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( IOStreamBufferTest, creationTest ) {
    bool ok( true );
    try {
        IOStreamBuffer<char> myBuffer;
    } catch ( ... ) {
        ok = false;
    }
    EXPECT_TRUE( ok );
}